

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O2

int __thiscall AggressiveBotStrategy::attackFromCountryIndex(AggressiveBotStrategy *this)

{
  Country *pCVar1;
  pointer ppCVar2;
  reference ppCVar3;
  pointer ppCVar4;
  pointer ppCVar5;
  ulong uVar6;
  Country *pCVar7;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *this_00;
  pointer ppCVar8;
  unsigned_long i;
  ulong __n;
  Country *pCVar9;
  
  this_00 = ((this->super_PlayerStrategy).player)->pOwnedCountries;
  ppCVar2 = (this_00->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  ppCVar4 = (this_00->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pCVar9 = (Country *)0x0;
  for (ppCVar5 = ppCVar4; ppCVar5 != ppCVar2; ppCVar5 = ppCVar5 + 1) {
    pCVar1 = *ppCVar5;
    pCVar7 = pCVar1;
    if ((pCVar9 != (Country *)0x0) &&
       (pCVar7 = pCVar9, *pCVar9->pNumberOfTroops < *pCVar1->pNumberOfTroops)) {
      for (ppCVar8 = (pCVar1->pAdjCountries->
                     super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                     super__Vector_impl_data._M_start;
          ppCVar8 !=
          (pCVar1->pAdjCountries->
          super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
          super__Vector_impl_data._M_finish; ppCVar8 = ppCVar8 + 1) {
        if (*(*ppCVar8)->pPlayerOwnerId != *pCVar1->pPlayerOwnerId) {
          pCVar7 = pCVar1;
        }
      }
    }
    pCVar9 = pCVar7;
  }
  (this->super_PlayerStrategy).from = pCVar9;
  uVar6 = 0xffffffffffffffff;
  for (__n = 0; __n < (ulong)((long)ppCVar2 - (long)ppCVar4 >> 3); __n = __n + 1) {
    ppCVar3 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at(this_00,__n);
    if (*(*ppCVar3)->cyID == *pCVar9->cyID) {
      uVar6 = __n;
    }
    uVar6 = uVar6 & 0xffffffff;
    this_00 = ((this->super_PlayerStrategy).player)->pOwnedCountries;
    ppCVar4 = (this_00->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl
              .super__Vector_impl_data._M_start;
    ppCVar2 = (this_00->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl
              .super__Vector_impl_data._M_finish;
  }
  return (int)uVar6;
}

Assistant:

int AggressiveBotStrategy::attackFromCountryIndex() {
    unsigned int fromCountryIndex = -1;
    Map::Country* biggestCountry = nullptr;
    for (auto* country : *player->getOwnedCountries()) {
        if (biggestCountry == nullptr) {
            biggestCountry = country;
        } else if (biggestCountry->getNumberOfTroops() < country->getNumberOfTroops()) {
            for (auto* neighbour : *country->getAdjCountries()) {
                if (neighbour->getPlayerOwnerID() != country->getPlayerOwnerID()) {
                    biggestCountry = country;
                }
            }
        }
    }

    from = biggestCountry;
    for (unsigned long i = 0; i < player->getOwnedCountries()->size(); i++) {
        if (player->getOwnedCountries()->at(i)->getCountryId() == biggestCountry->getCountryId()) {
            fromCountryIndex = i;
        }
    }

    return (int) fromCountryIndex;
}